

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void * bgui::anon_unknown_0::eventLoop(void *arg)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  undefined8 *in_RDI;
  XEvent event_2;
  XEvent event_1;
  inotify_event *event;
  int s;
  int i;
  fd_set *__arr;
  uint __i;
  char buffer [1024];
  int buflen;
  fd_set fds;
  int x11_fd;
  bool run;
  BaseWindowData *p;
  undefined1 auStackY_648 [152];
  XEvent *in_stack_fffffffffffffa50;
  BaseWindowData *in_stack_fffffffffffffa58;
  undefined1 local_588 [192];
  undefined4 *local_4c8;
  int local_4c0;
  int local_4bc;
  fd_set *local_4b8;
  uint local_4ac;
  undefined4 local_4a8 [259];
  undefined4 local_9c;
  fd_set local_98;
  int local_18;
  byte local_11;
  undefined8 *local_10;
  
  local_11 = 1;
  local_18 = *(int *)(in_RDI[1] + 0x10);
  local_10 = in_RDI;
  while ((local_11 & 1) != 0) {
    iVar1 = XPending(local_10[1]);
    if ((iVar1 == 0) && (*(int *)(local_10 + 10) != 0)) {
      local_9c = 0x400;
      local_4b8 = &local_98;
      for (local_4ac = 0; local_4ac < 0x10; local_4ac = local_4ac + 1) {
        local_4b8->fds_bits[local_4ac] = 0;
      }
      local_98.fds_bits[local_18 / 0x40] =
           1L << ((byte)((long)local_18 % 0x40) & 0x3f) | local_98.fds_bits[local_18 / 0x40];
      local_98.fds_bits[*(int *)(local_10 + 10) / 0x40] =
           1L << ((byte)((long)*(int *)(local_10 + 10) % 0x40) & 0x3f) |
           local_98.fds_bits[*(int *)(local_10 + 10) / 0x40];
      piVar2 = std::max<int>(&local_18,(int *)(local_10 + 10));
      select(*piVar2 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      local_4bc = 0;
      sVar3 = read(*(int *)(local_10 + 10),local_4a8,0x400);
      local_4c0 = (int)sVar3;
      for (; local_4bc < local_4c0; local_4bc = local_4bc + local_4c8[3] + 0x10) {
        local_4c8 = (undefined4 *)((long)local_4a8 + (long)local_4bc);
        usleep(250000);
        (**(code **)(*(long *)*local_10 + 0x30))((long *)*local_10,*local_4c8);
      }
      iVar1 = XPending(local_10[1]);
      if (0 < iVar1) {
        XNextEvent(local_10[1],local_588);
        local_11 = handleX11Event(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      }
    }
    else {
      XNextEvent(local_10[1],auStackY_648);
      local_11 = handleX11Event(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    }
  }
  *(undefined1 *)(local_10 + 0x1a) = 0;
  XUnmapWindow(local_10[1],local_10[3]);
  XFlush(local_10[1]);
  return (void *)0x0;
}

Assistant:

void *eventLoop(void *arg)
{
  BaseWindowData *p=static_cast<BaseWindowData *>(arg);
  bool run=true;

#ifdef INCLUDE_INOTIFY
  int x11_fd=ConnectionNumber(p->display);
#endif

  while (run)
  {
#ifdef INCLUDE_INOTIFY

    if (XPending(p->display) == 0 && p->inotify_fd != 0)
    {
      // wait for X11 and inotify events at the same time

      fd_set fds;
      const int buflen=1024;
      char buffer[buflen];

      FD_ZERO(&fds);
      FD_SET(x11_fd, &fds);
      FD_SET(p->inotify_fd, &fds);

      select(std::max(x11_fd, p->inotify_fd)+1, &fds, 0, 0, 0);

      // handle inotify events

      int i=0, s=read(p->inotify_fd, buffer, buflen);

      while (i < s)
      {
        struct inotify_event *event=reinterpret_cast<struct inotify_event *>(buffer+i);

        usleep(250000);

        p->parent->onFileChanged(event->wd);

        i+=sizeof(struct inotify_event)+event->len;
      }

      // handle X11 events

      if (XPending(p->display) > 0)
      {
        XEvent event;

        XNextEvent(p->display, &event);
        run=handleX11Event(p, event);
      }
    }
    else
#endif
    {
      // wait for and handle X11 events only

      XEvent event;

      XNextEvent(p->display, &event);
      run=handleX11Event(p, event);
    }
  }

  p->running=false;

  XUnmapWindow(p->display, p->window);
  XFlush(p->display);

  return 0;
}